

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

bool BinaryenMemoryIs64(BinaryenModuleRef module,char *name)

{
  pointer puVar1;
  Memory *pMVar2;
  undefined1 local_1b8 [392];
  string_view local_30;
  
  if (name == (char *)0x0) {
    puVar1 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(module->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 8) {
      name = *(char **)((long)(puVar1->_M_t).
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t + 8);
    }
    else {
      name = (char *)0x0;
    }
  }
  wasm::Name::Name((Name *)&local_30,name);
  pMVar2 = wasm::Module::getMemoryOrNull(module,(Name)local_30);
  if (pMVar2 != (Memory *)0x0) {
    return (pMVar2->addressType).id == 3;
  }
  wasm::Fatal::Fatal((Fatal *)local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10),"invalid memory \'");
  std::operator<<((ostream *)(local_1b8 + 0x10),name);
  wasm::Fatal::operator<<((Fatal *)local_1b8,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal((Fatal *)local_1b8);
}

Assistant:

bool BinaryenMemoryIs64(BinaryenModuleRef module, const char* name) {
  // Maintaining compatibility for instructions with a single memory
  if (name == nullptr && module->memories.size() == 1) {
    name = module->memories[0]->name.str.data();
  }
  auto* memory = ((Module*)module)->getMemoryOrNull(name);
  if (memory == nullptr) {
    Fatal() << "invalid memory '" << name << "'.";
  }
  return memory->is64();
}